

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char comparisonAffinity(Expr *pExpr)

{
  char local_11;
  char aff;
  Expr *pExpr_local;
  
  local_11 = sqlite3ExprAffinity(pExpr->pLeft);
  if (pExpr->pRight == (Expr *)0x0) {
    if ((pExpr->flags & 0x800) == 0x800) {
      local_11 = sqlite3CompareAffinity(((pExpr->x).pSelect)->pEList->a->pExpr,local_11);
    }
    else if (local_11 == '\0') {
      local_11 = 'b';
    }
  }
  else {
    local_11 = sqlite3CompareAffinity(pExpr->pRight,local_11);
  }
  return local_11;
}

Assistant:

static char comparisonAffinity(Expr *pExpr){
  char aff;
  assert( pExpr->op==TK_EQ || pExpr->op==TK_IN || pExpr->op==TK_LT ||
          pExpr->op==TK_GT || pExpr->op==TK_GE || pExpr->op==TK_LE ||
          pExpr->op==TK_NE || pExpr->op==TK_IS || pExpr->op==TK_ISNOT );
  assert( pExpr->pLeft );
  aff = sqlite3ExprAffinity(pExpr->pLeft);
  if( pExpr->pRight ){
    aff = sqlite3CompareAffinity(pExpr->pRight, aff);
  }else if( ExprHasProperty(pExpr, EP_xIsSelect) ){
    aff = sqlite3CompareAffinity(pExpr->x.pSelect->pEList->a[0].pExpr, aff);
  }else if( !aff ){
    aff = SQLITE_AFF_NONE;
  }
  return aff;
}